

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O0

uint __thiscall TURBOLINECOUNT::CLineCount::countThread(CLineCount *this,int thread_number)

{
  int iVar1;
  long *plVar2;
  int *piVar3;
  char *pcVar4;
  void *pvVar5;
  reference pvVar6;
  allocator<char> local_119;
  tlc_string_t local_118;
  int local_f4;
  char *pcStack_f0;
  int __err_2;
  char *ptrnext;
  char *ptr;
  size_t windowleft;
  tlc_fileoffset_t windowoffset;
  tlc_string_t local_c8;
  int local_a8;
  int __err_1;
  allocator<char> local_91;
  tlc_string_t local_90;
  int local_6c;
  long lStack_68;
  int __err;
  char *local_60;
  size_t mapsize;
  void *mem;
  tlc_linecount_t count;
  tlc_fileoffset_t lastmapsize;
  tlc_fileoffset_t curoffset;
  tlc_fileoffset_t stride;
  tlc_fileoffset_t startoffset;
  tlc_fileoffset_t buffersize;
  CLineCount *pCStack_18;
  int thread_number_local;
  CLineCount *this_local;
  
  startoffset = (this->m_parameters).buffersize;
  lastmapsize = startoffset * thread_number;
  curoffset = startoffset * this->m_actual_thread_count;
  count = 0;
  mem = (void *)0x0;
  mapsize = 0;
  stride = lastmapsize;
  buffersize._4_4_ = thread_number;
  pCStack_18 = this;
  while( true ) {
    if (this->m_filesize <= lastmapsize) {
      if ((mapsize == 0) || (iVar1 = munmap((void *)mapsize,count), iVar1 == 0)) {
        pvVar5 = mem;
        pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                           (&this->m_threadlinecounts,(long)buffersize._4_4_);
        *pvVar6 = (value_type)pvVar5;
        this_local._4_4_ = 0;
      }
      else {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        local_f4 = iVar1;
        pcVar4 = strerror(iVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,pcVar4,&local_119);
        setLastError(this,iVar1,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator(&local_119);
        this->m_thread_fail = true;
        this_local._4_4_ = 0xffffffff;
      }
      return this_local._4_4_;
    }
    if ((this->m_thread_fail & 1U) != 0) break;
    lStack_68 = this->m_filesize - lastmapsize;
    plVar2 = std::min<long>(&stack0xffffffffffffff98,&startoffset);
    local_60 = (char *)*plVar2;
    if ((mapsize != 0) && (iVar1 = munmap((void *)mapsize,count), iVar1 != 0)) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      local_6c = iVar1;
      pcVar4 = strerror(iVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar4,&local_91);
      setLastError(this,iVar1,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      this->m_thread_fail = true;
      return 0xffffffff;
    }
    mapsize = (size_t)mmap64((void *)0x0,(size_t)local_60,1,1,this->m_fh,lastmapsize);
    if ((char *)mapsize == (char *)0xffffffffffffffff) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      local_a8 = iVar1;
      pcVar4 = strerror(iVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,pcVar4,(allocator<char> *)((long)&windowoffset + 7));
      setLastError(this,iVar1,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&windowoffset + 7));
      this->m_thread_fail = true;
      return 0xffffffff;
    }
    windowleft = 0;
    ptr = local_60;
    ptrnext = (char *)mapsize;
    while (ptr != (char *)0x0) {
      pvVar5 = memchr(ptrnext,10,(size_t)ptr);
      if (pvVar5 == (void *)0x0) {
        ptr = (char *)0x0;
        pcStack_f0 = (char *)0x0;
      }
      else {
        pcStack_f0 = (char *)((long)pvVar5 + 1);
        mem = (void *)((long)mem + 1);
        ptr = ptr + -((long)pcStack_f0 - (long)ptrnext);
        ptrnext = pcStack_f0;
      }
    }
    if ((local_60 + lastmapsize == (char *)this->m_filesize) && (local_60[mapsize - 1] != '\n')) {
      mem = (void *)((long)mem + 1);
    }
    lastmapsize = curoffset + lastmapsize;
    count = (tlc_linecount_t)local_60;
  }
  return 0xffffffff;
}

Assistant:

unsigned int CLineCount::countThread(int thread_number)
{
	tlc_fileoffset_t buffersize = (tlc_fileoffset_t)m_parameters.buffersize;
	tlc_fileoffset_t startoffset = buffersize * (tlc_fileoffset_t)thread_number;
	tlc_fileoffset_t stride = buffersize * m_actual_thread_count;
	tlc_fileoffset_t curoffset = startoffset;
	tlc_fileoffset_t lastmapsize = 0;
	tlc_linecount_t count = 0;
	void *mem = NULL;

	while (curoffset < m_filesize)
	{
		if (m_thread_fail)
		{
			return -1;
		}

		// Get best file mapping window size
		size_t mapsize = (size_t)std::min((m_filesize - curoffset), buffersize);

		// Map view of file
#ifdef _WIN32
		
		if (mem)
		{
			if (!UnmapViewOfFile(mem))
			{
				setLastError(EINVAL, _T("memory unmap failed"));
				m_thread_fail = true;
				return -1;
			}
		}
		mem = MapViewOfFile(m_filemapping, FILE_MAP_READ, (DWORD)(curoffset >> 32), (DWORD)curoffset, (SIZE_T)mapsize);
#else
		if (mem)
		{
			if(munmap(mem, lastmapsize) !=0)
			{
				LCSETREALLASTERROR(EINVAL, _T("memory unmap failed"));
				m_thread_fail = true;
				return -1;
			}
		}
		mem = MMAP(NULL, mapsize, PROT_READ, MAP_FILE | MAP_SHARED, m_fh, curoffset);
//		printf("%p %lld %lld\n",mem, mapsize, curoffset);
#endif		
		if (mem == MAP_FAILED)
		{
			LCSETREALLASTERROR(EINVAL, _T("memory map failed"));
			m_thread_fail = true;
			return -1;
		}

		// Count newlines in buffer
		tlc_fileoffset_t windowoffset = 0;
		size_t windowleft = mapsize;
		char *ptr = (char *)mem;
		while (windowleft > 0)
		{
			char *ptrnext = (char *)memchr(ptr, '\n', windowleft);
			if (ptrnext)
			{
				ptrnext++;
				count++;
				windowleft -= (ptrnext - ptr);
				ptr = ptrnext;
			}
			else
			{
				windowleft = 0;
			}
		}

		// See if we need to account for end of file not ending with line terminator
		if ((curoffset + mapsize) == m_filesize)
		{
			if (*((char *)mem + (mapsize - 1)) != '\n')
			{
				count++;
			}
		}

		// Move to next buffer
		curoffset += stride;
		lastmapsize = mapsize;

//		printf("%lld\n", curoffset);
	}

	// Clean up memory map
#ifdef _WIN32
	if (mem)
	{
		if (!UnmapViewOfFile(mem))
		{
			setLastError(EINVAL, _T("memory unmap failed"));
			m_thread_fail = true;
			return -1;
		}
	}
#else
	if (mem)
	{
		if (munmap(mem, lastmapsize) != 0)
		{
			LCSETREALLASTERROR(EINVAL, _T("memory unmap failed"));
			m_thread_fail = true;
			return -1;
		}
	}
#endif

	// Save count for this thread
	m_threadlinecounts[thread_number] = count;

	return 0;
}